

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O1

void IPdr_ManPrintClauses(Vec_Vec_t *vClauses,int kStart,int nRegs)

{
  void *pvVar1;
  int iVar2;
  Pdr_Set_t *p;
  Pdr_Set_t *pPVar3;
  long lVar4;
  ulong uVar5;
  
  if (kStart < vClauses->nSize) {
    uVar5 = (ulong)(uint)kStart;
    iVar2 = 0;
    p = (Pdr_Set_t *)vClauses;
    do {
      if (kStart < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar1 = vClauses->pArray[uVar5];
      if (1 < (long)*(int *)((long)pvVar1 + 4)) {
        p = *(Pdr_Set_t **)((long)pvVar1 + 8);
        qsort(p,(long)*(int *)((long)pvVar1 + 4),8,Pdr_SetCompare);
      }
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar4 = 0;
        pPVar3 = p;
        do {
          p = *(Pdr_Set_t **)(*(long *)((long)pvVar1 + 8) + lVar4 * 8);
          Abc_Print((int)pPVar3,"Frame[%4d]Cube[%4d] = ",uVar5 & 0xffffffff,
                    (ulong)(uint)(iVar2 + (int)lVar4));
          ZPdr_SetPrint(p);
          Abc_Print((int)p,"\n");
          lVar4 = lVar4 + 1;
          pPVar3 = p;
        } while (lVar4 < *(int *)((long)pvVar1 + 4));
        iVar2 = iVar2 + (int)lVar4;
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < vClauses->nSize);
  }
  return;
}

Assistant:

void IPdr_ManPrintClauses( Vec_Vec_t * vClauses, int kStart, int nRegs )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, k, Counter = 0;
    Vec_VecForEachLevelStart( vClauses, vArrayK, k, kStart )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, i )
        {
            Abc_Print( 1, "Frame[%4d]Cube[%4d] = ", k, Counter++ );
            // Pdr_SetPrint( stdout, pCube, nRegs, NULL );  
            ZPdr_SetPrint( pCube );  
            Abc_Print( 1, "\n" ); 
        }
    }
}